

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.c
# Opt level: O3

int get_attr_id(attr_list list,int item_no,atom_t *item)

{
  byte bVar1;
  attr_list *pp_Var2;
  uint uVar3;
  attr_list p_Var4;
  int_attr_struct *piVar5;
  attr_p paVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  
  if (global_as_lock != (atl_lock_func)0x0) {
    (*global_as_lock)(global_as_lock_data);
  }
  if ((global_as == (atom_server)0x0) &&
     (global_as = init_atom_server(prefill_atom_cache), init_global_atom_server_first == '\0')) {
    init_global_atom_server_first = '\x01';
  }
  if (global_as_unlock != (atl_lock_func)0x0) {
    (*global_as_unlock)(global_as_lock_data);
  }
  uVar3 = 0;
  if (list != (attr_list)0x0 && -1 < item_no) {
    if (list->list_of_lists == 0) {
      piVar5 = (list->l).list.iattrs;
      bVar1 = piVar5->int_attr_count;
      if ((uint)bVar1 + (uint)bVar1 <= (uint)item_no) {
        return 0;
      }
      if ((uint)item_no < (uint)bVar1) {
        paVar6 = (attr_p)(piVar5->iattr + (uint)item_no);
      }
      else {
        paVar6 = (list->l).list.attributes + ((long)item_no - (ulong)bVar1);
      }
      uVar3 = 1;
    }
    else {
      uVar7 = (ulong)(list->l).lists.sublist_count;
      if ((long)uVar7 < 1) {
        return 0;
      }
      pp_Var2 = (list->l).lists.lists;
      p_Var4 = *pp_Var2;
      piVar5 = (p_Var4->l).list.iattrs;
      bVar1 = piVar5->int_attr_count;
      iVar8 = (uint)bVar1 + (uint)bVar1;
      uVar3 = 1;
      if (iVar8 < item_no) {
        uVar9 = 0;
        do {
          if (uVar7 - 1 == uVar9) {
            return 0;
          }
          item_no = item_no - iVar8;
          p_Var4 = pp_Var2[uVar9 + 1];
          piVar5 = (p_Var4->l).list.iattrs;
          bVar1 = piVar5->int_attr_count;
          iVar8 = (uint)bVar1 + (uint)bVar1;
          uVar9 = uVar9 + 1;
        } while (iVar8 < item_no);
        uVar3 = (uint)(uVar9 < uVar7);
      }
      if (item_no < (int)(uint)bVar1) {
        paVar6 = (attr_p)(piVar5->iattr + item_no);
      }
      else {
        paVar6 = (p_Var4->l).list.attributes + (int)(item_no - (uint)bVar1);
      }
    }
    *item = paVar6->attr_id;
  }
  return uVar3;
}

Assistant:

extern int
get_attr_id(attr_list list, int item_no, atom_t *item)
{

    atl_lock();
    init_global_atom_server(&global_as);
    atl_unlock();

    if (item_no < 0) return 0;

    if (list == NULL) return 0;

    if (!list->list_of_lists) {
        int int_attr_count = list->l.list.iattrs->int_attr_count;
        int other_attr_count = list->l.list.iattrs->int_attr_count;
        int total_attr_count = int_attr_count + other_attr_count;

        if (item_no >= total_attr_count) return 0;

        if (item_no < int_attr_count) {
            *item = list->l.list.iattrs->iattr[item_no].attr_id;
	    return 1;
        } else {
            item_no -= int_attr_count;
            *item = list->l.list.attributes[item_no].attr_id;
	    return 1;
        }
    } else {
        int i;
        for (i=0; i<list->l.lists.sublist_count; i++) {
            attr_list atl = list->l.lists.lists[i];
            int int_attr_count = atl->l.list.iattrs->int_attr_count;
            int other_attr_count = atl->l.list.iattrs->int_attr_count;
            int total_attr_count = int_attr_count + other_attr_count;

            if (item_no > total_attr_count) {
                item_no -= total_attr_count;
	    } else {
                if (item_no < int_attr_count) {
                    *item = atl->l.list.iattrs->iattr[item_no].attr_id;
		    return 1;
                } else {
                    item_no -= int_attr_count;
                    *item = atl->l.list.attributes[item_no].attr_id;
		    return 1;
                }
            }
        }
    }
    return 0;
}